

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTPNIfnilBase::fold_constants(CTPNIfnilBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CTcPrsNode **ppCVar2;
  
  iVar1 = (*(this->first_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])();
  this->first_ = (CTcPrsNode *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->second_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])(this->second_,symtab);
  this->second_ = (CTcPrsNode *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*(this->first_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
  if (CONCAT44(extraout_var_01,iVar1) != 0) {
    iVar1 = (*(this->first_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    ppCVar2 = &this->second_;
    if (*(int *)CONCAT44(extraout_var_02,iVar1) != 1) {
      ppCVar2 = &this->first_;
    }
    this = (CTPNIfnilBase *)*ppCVar2;
  }
  return &this->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNIfnilBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* fold constants in the subnodes */
    first_ = first_->fold_constants(symtab);
    second_ = second_->fold_constants(symtab);

    /* 
     *   if the first is now a constant, we can fold this entire expression
     *   node by choosing the first or second node.  Otherwise return myself
     *   unchanged.  
     */
    if (first_->is_const())
    {
        /* 
         *   if the first expression is nil, return the second, otherwise
         *   return the first 
         */
        return (first_->get_const_val()->get_type() == TC_CVT_NIL
                ? second_ : first_);
    }
    else
    {
        /* we can't fold this node any further - return it unchanged */
        return this;
    }
}